

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O1

Vec_Ptr_t * Prs_ManReadBlif(char *pFileName)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  Prs_Man_t *p;
  FILE *__stream;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 extraout_var;
  Abc_Nam_t *pAVar9;
  Hash_IntMan_t *pHVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Ptr_t *pVVar13;
  void **ppvVar14;
  byte *pbVar15;
  ulong uVar16;
  Prs_Ntk_t *pPVar17;
  int iVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  size_t sVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  
  p = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName == (char *)0x0) {
LAB_003e1552:
    pAVar9 = Abc_NamStart(1000,0x18);
    p->pStrs = pAVar9;
    pAVar9 = Abc_NamStart(100,0x18);
    p->pFuns = pAVar9;
    pHVar10 = (Hash_IntMan_t *)calloc(1,0x18);
    uVar21 = 1099;
    while( true ) {
      do {
        uVar20 = uVar21;
        uVar21 = uVar20 + 1;
      } while ((uVar20 & 1) != 0);
      if (uVar21 < 9) break;
      iVar18 = 5;
      while (uVar21 % (iVar18 - 2U) != 0) {
        uVar5 = iVar18 * iVar18;
        iVar18 = iVar18 + 2;
        if (uVar21 < uVar5) goto LAB_003e15c0;
      }
    }
LAB_003e15c0:
    pVVar11 = (Vec_Int_t *)malloc(0x10);
    uVar5 = 0x10;
    if (0xe < uVar20) {
      uVar5 = uVar21;
    }
    pVVar11->nSize = 0;
    pVVar11->nCap = uVar5;
    piVar12 = (int *)malloc((long)(int)uVar5 << 2);
    pVVar11->pArray = piVar12;
    pVVar11->nSize = uVar21;
    if (piVar12 != (int *)0x0) {
      memset(piVar12,0,(long)(int)uVar21 << 2);
    }
    pHVar10->vTable = pVVar11;
    pVVar11 = (Vec_Int_t *)malloc(0x10);
    pVVar11->nCap = 0x1130;
    pVVar11->nSize = 0;
    piVar12 = (int *)malloc(0x44c0);
    pVVar11->pArray = piVar12;
    pHVar10->vObjs = pVVar11;
    piVar12[0] = 0;
    piVar12[1] = 0;
    piVar12[2] = 0;
    piVar12[3] = 0;
    pVVar11->nSize = 4;
    pHVar10->nRefs = 1;
    p->vHash = pHVar10;
    pVVar13 = (Vec_Ptr_t *)malloc(0x10);
    pVVar13->nCap = 100;
    pVVar13->nSize = 0;
    ppvVar14 = (void **)malloc(800);
    pVVar13->pArray = ppvVar14;
    p->vNtks = pVVar13;
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      iVar18 = puts("Cannot open input file.");
      pcVar8 = (char *)CONCAT44(extraout_var,iVar18);
      pcVar7 = (char *)0x0;
    }
    else {
      fseek(__stream,0,2);
      lVar6 = ftell(__stream);
      rewind(__stream);
      lVar22 = lVar6 << 0x20;
      pcVar7 = (char *)malloc(lVar22 + 0x1000000000 >> 0x20);
      *pcVar7 = '\n';
      fread(pcVar7 + 1,(long)(int)lVar6,1,__stream);
      fclose(__stream);
      pcVar7[lVar22 + 0x100000000 >> 0x20] = '\n';
      pcVar7[lVar22 + 0x200000000 >> 0x20] = '\0';
      pcVar8 = pcVar7 + (long)(int)lVar6 + 3;
    }
    if (pcVar7 != (char *)0x0) {
      p->pName = pFileName;
      p->pBuffer = pcVar7;
      p->pLimit = pcVar8;
      p->pCur = pcVar7;
      goto LAB_003e1552;
    }
    p = (Prs_Man_t *)0x0;
  }
  if (p == (Prs_Man_t *)0x0) {
    return (Vec_Ptr_t *)0x0;
  }
  Abc_NamStrFindOrAdd(p->pFuns," 0\n",(int *)0x0);
  Abc_NamStrFindOrAdd(p->pFuns," 1\n",(int *)0x0);
  lVar6 = 1;
  do {
    Abc_NamStrFindOrAdd(p->pStrs,s_BlifTypes[lVar6],(int *)0x0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0xb);
  iVar18 = Abc_NamObjNumMax(p->pStrs);
  if (iVar18 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                  ,0x42,"void Prs_NtkAddBlifDirectives(Prs_Man_t *)");
  }
  pcVar7 = p->pCur;
  if (pcVar7[1] != '\0') {
    pcVar8 = p->ErrorStr;
    pVVar11 = &p->vTemp;
    do {
      pbVar15 = (byte *)(pcVar7 + 1);
      if (*pcVar7 != '\n') {
        __assert_fail("Prs_ManIsChar(p, \'\\n\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                      ,0x180,"int Prs_ManReadLines(Prs_Man_t *)");
      }
LAB_003e1713:
      p->pCur = (char *)pbVar15;
      bVar4 = *pbVar15;
      if (bVar4 < 0x20) {
        if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e1765;
LAB_003e174b:
        pbVar15 = pbVar15 + 1;
        goto LAB_003e1713;
      }
      if (bVar4 == 0x20) goto LAB_003e174b;
      if (bVar4 == 0x5c) {
        pbVar19 = pbVar15 + 1;
        do {
          p->pCur = (char *)pbVar19;
          pbVar15 = pbVar19 + 1;
          bVar4 = *pbVar19;
          pbVar19 = pbVar15;
        } while (bVar4 != 10);
        goto LAB_003e1713;
      }
      if (bVar4 == 0x23) {
        do {
          pbVar15 = pbVar15 + 1;
          p->pCur = (char *)pbVar15;
        } while (*pbVar15 != 10);
      }
LAB_003e1765:
      bVar4 = *p->pCur;
      uVar16 = (ulong)bVar4;
      if (0x31 < uVar16) {
LAB_003e23a9:
        if (bVar4 != 10) {
          if (bVar4 != 9) {
            __assert_fail("Prs_ManIsLit(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                          ,0xc9,"int Prs_ManReadCube(Prs_Man_t *)");
          }
          goto LAB_003e2641;
        }
        goto LAB_003e23b2;
      }
      if ((0x3200000000000U >> (uVar16 & 0x3f) & 1) != 0) {
        while( true ) {
          pbVar15 = (byte *)p->pCur;
          if ((0x31 < (ulong)*pbVar15) || ((0x3200000000000U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))
          break;
          p->pCur = (char *)(pbVar15 + 1);
          bVar4 = *pbVar15;
          uVar21 = (p->vCover).nCap;
          if ((p->vCover).nSize == uVar21) {
            if ((int)uVar21 < 0x10) {
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              sVar23 = 0x10;
            }
            else {
              sVar23 = (ulong)uVar21 * 2;
              if ((int)sVar23 <= (int)uVar21) goto LAB_003e1801;
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar23);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,sVar23);
              }
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = (int)sVar23;
          }
LAB_003e1801:
          iVar18 = (p->vCover).nSize;
          (p->vCover).nSize = iVar18 + 1;
          (p->vCover).pArray[iVar18] = bVar4;
        }
LAB_003e1829:
        bVar4 = *pbVar15;
        if (bVar4 < 0x20) {
          if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e1874;
LAB_003e1822:
          pbVar15 = pbVar15 + 1;
LAB_003e1825:
          p->pCur = (char *)pbVar15;
          goto LAB_003e1829;
        }
        if (bVar4 == 0x20) goto LAB_003e1822;
        if (bVar4 == 0x5c) {
          pbVar19 = pbVar15 + 1;
          do {
            p->pCur = (char *)pbVar19;
            pbVar15 = pbVar19 + 1;
            bVar4 = *pbVar19;
            pbVar19 = pbVar15;
          } while (bVar4 != 10);
          goto LAB_003e1825;
        }
        if (bVar4 == 0x23) {
          do {
            pbVar15 = pbVar15 + 1;
            p->pCur = (char *)pbVar15;
          } while (*pbVar15 != 10);
        }
LAB_003e1874:
        uVar16 = (ulong)(byte)*p->pCur;
        if (uVar16 < 0x32) {
          if ((0x3200000000000U >> (uVar16 & 0x3f) & 1) == 0) {
            if (uVar16 != 10) {
              if ((0x100002200U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_003e2641;
              goto LAB_003e19c2;
            }
            if ((p->vCover).nSize == 1) {
              pcVar7 = (p->vCover).pArray;
              cVar2 = *pcVar7;
              if ((p->vCover).nCap == 1) {
                pcVar7 = (char *)realloc(pcVar7,0x10);
                (p->vCover).pArray = pcVar7;
                (p->vCover).nCap = 0x10;
              }
              iVar18 = (p->vCover).nSize;
              (p->vCover).nSize = iVar18 + 1;
              (p->vCover).pArray[iVar18] = cVar2;
              if ((p->vCover).nSize < 1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                              ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
              }
              *(p->vCover).pArray = ' ';
              uVar21 = (p->vCover).nCap;
              if ((p->vCover).nSize == uVar21) {
                if ((int)uVar21 < 0x10) {
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,0x10);
                  }
                  sVar23 = 0x10;
                }
                else {
                  sVar23 = (ulong)uVar21 * 2;
                  if ((int)sVar23 <= (int)uVar21) goto LAB_003e21fb;
                  pcVar7 = (p->vCover).pArray;
                  if (pcVar7 == (char *)0x0) {
                    pcVar7 = (char *)malloc(sVar23);
                  }
                  else {
                    pcVar7 = (char *)realloc(pcVar7,sVar23);
                  }
                }
                (p->vCover).pArray = pcVar7;
                (p->vCover).nCap = (int)sVar23;
              }
LAB_003e21fb:
              iVar18 = (p->vCover).nSize;
              (p->vCover).nSize = iVar18 + 1;
              (p->vCover).pArray[iVar18] = '\n';
              goto LAB_003e220d;
            }
            if (*pcVar8 != '\0') goto LAB_003e261d;
            builtin_strncpy(pcVar8,"Cannot read cube.",0x12);
            goto LAB_003e1bcd;
          }
          uVar21 = (p->vCover).nCap;
          if ((p->vCover).nSize == uVar21) {
            if ((int)uVar21 < 0x10) {
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              sVar23 = 0x10;
            }
            else {
              sVar23 = (ulong)uVar21 * 2;
              if ((int)sVar23 <= (int)uVar21) goto LAB_003e1a20;
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar23);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,sVar23);
              }
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = (int)sVar23;
          }
LAB_003e1a20:
          iVar18 = (p->vCover).nSize;
          (p->vCover).nSize = iVar18 + 1;
          (p->vCover).pArray[iVar18] = ' ';
          pcVar7 = p->pCur;
          p->pCur = pcVar7 + 1;
          cVar2 = *pcVar7;
          uVar21 = (p->vCover).nCap;
          if ((p->vCover).nSize == uVar21) {
            if ((int)uVar21 < 0x10) {
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              sVar23 = 0x10;
            }
            else {
              sVar23 = (ulong)uVar21 * 2;
              if ((int)sVar23 <= (int)uVar21) goto LAB_003e1aa0;
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar23);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,sVar23);
              }
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = (int)sVar23;
          }
LAB_003e1aa0:
          iVar18 = (p->vCover).nSize;
          (p->vCover).nSize = iVar18 + 1;
          (p->vCover).pArray[iVar18] = cVar2;
          uVar21 = (p->vCover).nCap;
          if ((p->vCover).nSize == uVar21) {
            if ((int)uVar21 < 0x10) {
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,0x10);
              }
              sVar23 = 0x10;
            }
            else {
              sVar23 = (ulong)uVar21 * 2;
              if ((int)sVar23 <= (int)uVar21) goto LAB_003e1b11;
              pcVar7 = (p->vCover).pArray;
              if (pcVar7 == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar23);
              }
              else {
                pcVar7 = (char *)realloc(pcVar7,sVar23);
              }
            }
            (p->vCover).pArray = pcVar7;
            (p->vCover).nCap = (int)sVar23;
          }
LAB_003e1b11:
          iVar18 = (p->vCover).nSize;
          (p->vCover).nSize = iVar18 + 1;
          (p->vCover).pArray[iVar18] = '\n';
          pbVar15 = (byte *)p->pCur;
LAB_003e1b27:
          bVar4 = *pbVar15;
          if (bVar4 < 0x20) {
            if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e1b79;
LAB_003e1b5b:
            pbVar15 = pbVar15 + 1;
LAB_003e1b5e:
            p->pCur = (char *)pbVar15;
            goto LAB_003e1b27;
          }
          if (bVar4 == 0x20) goto LAB_003e1b5b;
          if (bVar4 == 0x5c) {
            pbVar19 = pbVar15 + 1;
            do {
              p->pCur = (char *)pbVar19;
              pbVar15 = pbVar19 + 1;
              bVar4 = *pbVar19;
              pbVar19 = pbVar15;
            } while (bVar4 != 10);
            goto LAB_003e1b5e;
          }
          if (bVar4 == 0x23) {
            do {
              pbVar15 = pbVar15 + 1;
              p->pCur = (char *)pbVar15;
            } while (*pbVar15 != 10);
          }
LAB_003e1b79:
          bVar4 = *p->pCur;
          if (bVar4 < 0xd) {
            if (bVar4 == 10) goto LAB_003e220d;
            if (bVar4 == 9) goto LAB_003e2641;
          }
          else if ((bVar4 == 0x20) || (bVar4 == 0xd)) goto LAB_003e2641;
          if (*pcVar8 != '\0') goto LAB_003e261d;
          builtin_strncpy(p->ErrorStr + 9,"ad end of cube.",0x10);
          uVar24._0_1_ = 'C';
          uVar24._1_1_ = 'a';
          uVar24._2_1_ = 'n';
          uVar24._3_1_ = 'n';
          uVar25._0_1_ = 'o';
          uVar25._1_1_ = 't';
          uVar25._2_1_ = ' ';
          uVar25._3_1_ = 'r';
          uVar26._0_1_ = 'e';
          uVar26._1_1_ = 'a';
          uVar26._2_1_ = 'd';
          uVar26._3_1_ = ' ';
          uVar27._0_1_ = 'e';
          uVar27._1_1_ = 'n';
          uVar27._2_1_ = 'd';
          uVar27._3_1_ = ' ';
        }
        else {
LAB_003e19c2:
          if (*pcVar8 != '\0') goto LAB_003e261d;
          builtin_strncpy(p->ErrorStr + 0xc,"output literal.",0x10);
          uVar24._0_1_ = 'C';
          uVar24._1_1_ = 'a';
          uVar24._2_1_ = 'n';
          uVar24._3_1_ = 'n';
          uVar25._0_1_ = 'o';
          uVar25._1_1_ = 't';
          uVar25._2_1_ = ' ';
          uVar25._3_1_ = 'r';
          uVar26._0_1_ = 'e';
          uVar26._1_1_ = 'a';
          uVar26._2_1_ = 'd';
          uVar26._3_1_ = ' ';
          uVar27._0_1_ = 'o';
          uVar27._1_1_ = 'u';
          uVar27._2_1_ = 't';
          uVar27._3_1_ = 'p';
        }
        goto LAB_003e1bc8;
      }
      if (uVar16 != 0x2e) {
        if ((0x100002000U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_003e2641;
        goto LAB_003e23a9;
      }
      iVar18 = (p->vCover).nSize;
      if (0 < (long)iVar18) {
        bVar4 = 4;
        if (iVar18 == 0) {
LAB_003e18fe:
          puVar1 = &p->pNtk->field_0x4;
          *puVar1 = *puVar1 | bVar4;
        }
        else if (iVar18 == 2) {
          cVar2 = (p->vCover).pArray[(long)iVar18 + -1];
          if (cVar2 != '0') {
            if (cVar2 != '1') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                            ,0xe9,"void Prs_ManSaveCover(Prs_Man_t *)");
            }
            bVar4 = 8;
          }
          goto LAB_003e18fe;
        }
        uVar21 = (p->vCover).nSize;
        if ((int)uVar21 < 1) {
          __assert_fail("Vec_StrSize(&p->vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                        ,0xeb,"void Prs_ManSaveCover(Prs_Man_t *)");
        }
        uVar20 = (p->vCover).nCap;
        if (uVar21 == uVar20) {
          if ((int)uVar20 < 0x10) {
            pcVar7 = (p->vCover).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,0x10);
            }
            sVar23 = 0x10;
          }
          else {
            sVar23 = (ulong)uVar20 * 2;
            if ((int)sVar23 <= (int)uVar20) goto LAB_003e1cd6;
            pcVar7 = (p->vCover).pArray;
            if (pcVar7 == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar23);
            }
            else {
              pcVar7 = (char *)realloc(pcVar7,sVar23);
            }
          }
          (p->vCover).pArray = pcVar7;
          (p->vCover).nCap = (int)sVar23;
        }
LAB_003e1cd6:
        iVar18 = (p->vCover).nSize;
        (p->vCover).nSize = iVar18 + 1;
        (p->vCover).pArray[iVar18] = '\0';
        iVar18 = Abc_NamStrFindOrAdd(p->pFuns,(p->vCover).pArray,(int *)0x0);
        (p->vCover).nSize = 0;
        pPVar17 = p->pNtk;
        lVar6 = (long)(pPVar17->vObjs).nSize;
        if (((lVar6 < 1) || (iVar3 = (pPVar17->vObjs).pArray[lVar6 + -1], iVar3 < -1)) ||
           (uVar21 = iVar3 + 1, (pPVar17->vBoxes).nSize <= (int)uVar21)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar12 = (pPVar17->vBoxes).pArray;
        if (piVar12[uVar21] != 1) {
          __assert_fail("Prs_BoxNtk(p->pNtk, Prs_NtkBoxNum(p->pNtk)-1) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                        ,0xf1,"void Prs_ManSaveCover(Prs_Man_t *)");
        }
        piVar12[uVar21] = iVar18;
      }
      iVar18 = Prs_ManReadName(p);
      switch(iVar18) {
      case 1:
        if (p->pNtk == (Prs_Ntk_t *)0x0) {
          iVar18 = Prs_ManReadName(p);
          if (iVar18 == 0) {
            if (*pcVar8 != '\0') goto LAB_003e261d;
            builtin_strncpy(pcVar8,"Cannot read model name.",0x18);
          }
          else {
            if (p->pNtk != (Prs_Ntk_t *)0x0) {
              __assert_fail("p->pNtk == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                            ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
            }
            pPVar17 = (Prs_Ntk_t *)calloc(1,0xf0);
            p->pNtk = pPVar17;
            pPVar17->iModuleName = iVar18;
            pPVar17->field_0x4 = pPVar17->field_0x4 & 0xfd;
            pAVar9 = Abc_NamRef(p->pStrs);
            p->pNtk->pStrs = pAVar9;
            pAVar9 = Abc_NamRef(p->pFuns);
            pPVar17 = p->pNtk;
            pPVar17->pFuns = pAVar9;
            pHVar10 = p->vHash;
            piVar12 = &pHVar10->nRefs;
            *piVar12 = *piVar12 + 1;
            pPVar17->vHash = pHVar10;
            pVVar13 = p->vNtks;
            uVar21 = pVVar13->nCap;
            if (pVVar13->nSize == uVar21) {
              if ((int)uVar21 < 0x10) {
                if (pVVar13->pArray == (void **)0x0) {
                  ppvVar14 = (void **)malloc(0x80);
                }
                else {
                  ppvVar14 = (void **)realloc(pVVar13->pArray,0x80);
                }
                pVVar13->pArray = ppvVar14;
                iVar18 = 0x10;
              }
              else {
                iVar18 = uVar21 * 2;
                if (iVar18 <= (int)uVar21) goto LAB_003e22ca;
                if (pVVar13->pArray == (void **)0x0) {
                  ppvVar14 = (void **)malloc((ulong)uVar21 << 4);
                }
                else {
                  ppvVar14 = (void **)realloc(pVVar13->pArray,(ulong)uVar21 << 4);
                }
                pVVar13->pArray = ppvVar14;
              }
              pVVar13->nCap = iVar18;
            }
LAB_003e22ca:
            iVar18 = pVVar13->nSize;
            pVVar13->nSize = iVar18 + 1;
            pVVar13->pArray[iVar18] = pPVar17;
            pbVar15 = (byte *)p->pCur;
LAB_003e22e5:
            bVar4 = *pbVar15;
            if (bVar4 < 0x20) {
              if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e2337;
LAB_003e2319:
              pbVar15 = pbVar15 + 1;
LAB_003e231c:
              p->pCur = (char *)pbVar15;
              goto LAB_003e22e5;
            }
            if (bVar4 == 0x20) goto LAB_003e2319;
            if (bVar4 == 0x5c) {
              pbVar19 = pbVar15 + 1;
              do {
                p->pCur = (char *)pbVar19;
                pbVar15 = pbVar19 + 1;
                bVar4 = *pbVar19;
                pbVar19 = pbVar15;
              } while (bVar4 != 10);
              goto LAB_003e231c;
            }
            if (bVar4 == 0x23) {
              do {
                pbVar15 = pbVar15 + 1;
                p->pCur = (char *)pbVar15;
              } while (*pbVar15 != 10);
            }
LAB_003e2337:
            bVar4 = *p->pCur;
            if (bVar4 < 0xd) {
              if (bVar4 == 10) goto LAB_003e220d;
              if (bVar4 == 9) goto LAB_003e2641;
            }
            else if ((bVar4 == 0x20) || (bVar4 == 0xd)) {
LAB_003e2641:
              __assert_fail("!Prs_ManIsSpace(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadBlif.c"
                            ,0x84,"void Prs_ManSkipSpaces(Prs_Man_t *)");
            }
            if (*pcVar8 != '\0') goto LAB_003e261d;
            builtin_strncpy(pcVar8,"Trailing symbols on .model line.",0x21);
          }
        }
        else {
          if (*pcVar8 != '\0') goto LAB_003e261d;
          builtin_strncpy(pcVar8,"Parsing previous model is unfinished.",0x26);
        }
        break;
      case 2:
        pPVar17 = p->pNtk;
        (p->vTemp).nSize = 0;
        iVar18 = Prs_ManReadName(p);
        if (iVar18 != 0) {
          do {
            Vec_IntPush(pVVar11,iVar18);
            Vec_IntPush(&pPVar17->vOrder,iVar18 * 4 + 3);
            iVar18 = Prs_ManReadName(p);
          } while (iVar18 != 0);
        }
        iVar18 = (p->vTemp).nSize;
        if (iVar18 != 0) {
          if (0 < iVar18) {
            pPVar17 = p->pNtk;
            lVar6 = 0;
            do {
              Vec_IntPush(&pPVar17->vInouts,(p->vTemp).pArray[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar6 < (p->vTemp).nSize);
          }
          goto LAB_003e202e;
        }
LAB_003e203b:
        if (*pcVar8 != '\0') {
LAB_003e261d:
          __assert_fail("!p->ErrorStr[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                        ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
        }
        builtin_strncpy(pcVar8,"Signal list is empty.",0x16);
        break;
      case 3:
        pPVar17 = p->pNtk;
        (p->vTemp).nSize = 0;
        iVar18 = Prs_ManReadName(p);
        if (iVar18 != 0) {
          do {
            Vec_IntPush(pVVar11,iVar18);
            Vec_IntPush(&pPVar17->vOrder,iVar18 * 4 + 1);
            iVar18 = Prs_ManReadName(p);
          } while (iVar18 != 0);
        }
        iVar18 = (p->vTemp).nSize;
        if (iVar18 == 0) goto LAB_003e203b;
        if (0 < iVar18) {
          pPVar17 = p->pNtk;
          lVar6 = 0;
          do {
            Vec_IntPush(&pPVar17->vInputs,(p->vTemp).pArray[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (p->vTemp).nSize);
        }
        goto LAB_003e202e;
      case 4:
        pPVar17 = p->pNtk;
        (p->vTemp).nSize = 0;
        iVar18 = Prs_ManReadName(p);
        if (iVar18 != 0) {
          do {
            Vec_IntPush(pVVar11,iVar18);
            Vec_IntPush(&pPVar17->vOrder,iVar18 * 4 + 2);
            iVar18 = Prs_ManReadName(p);
          } while (iVar18 != 0);
        }
        iVar18 = (p->vTemp).nSize;
        if (iVar18 == 0) goto LAB_003e203b;
        if (0 < iVar18) {
          pPVar17 = p->pNtk;
          lVar6 = 0;
          do {
            Vec_IntPush(&pPVar17->vOutputs,(p->vTemp).pArray[lVar6]);
            lVar6 = lVar6 + 1;
          } while (lVar6 < (p->vTemp).nSize);
        }
LAB_003e202e:
        iVar18 = 0;
        goto LAB_003e220f;
      case 5:
        (p->vTemp).nSize = 0;
        iVar18 = Prs_ManReadName(p);
        while (iVar18 != 0) {
          Vec_IntPush(pVVar11,0);
          Vec_IntPush(pVVar11,iVar18);
          iVar18 = Prs_ManReadName(p);
        }
        if ((p->vTemp).nSize == 0) goto LAB_003e203b;
        iVar18 = 0;
        Prs_NtkAddBox(p->pNtk,1,0,pVVar11);
        goto LAB_003e220f;
      case 6:
        iVar18 = 0;
        goto LAB_003e2074;
      case 7:
        iVar18 = 1;
LAB_003e2074:
        iVar18 = Prs_ManReadBox(p,iVar18);
        goto LAB_003e220f;
      case 8:
        iVar18 = Prs_ManReadName(p);
        (p->vTemp).nSize = 0;
        if (iVar18 != 0) {
LAB_003e271a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (*pcVar8 != '\0') goto LAB_003e261d;
        builtin_strncpy(p->ErrorStr + 9,"ad latch input.",0x10);
        uVar24._0_1_ = 'C';
        uVar24._1_1_ = 'a';
        uVar24._2_1_ = 'n';
        uVar24._3_1_ = 'n';
        uVar25._0_1_ = 'o';
        uVar25._1_1_ = 't';
        uVar25._2_1_ = ' ';
        uVar25._3_1_ = 'r';
        uVar26._0_1_ = 'e';
        uVar26._1_1_ = 'a';
        uVar26._2_1_ = 'd';
        uVar26._3_1_ = ' ';
        uVar27._0_1_ = 'l';
        uVar27._1_1_ = 'a';
        uVar27._2_1_ = 't';
        uVar27._3_1_ = 'c';
        goto LAB_003e1bc8;
      case 9:
        iVar18 = Prs_ManReadName(p);
        (p->vTemp).nSize = 0;
        if (iVar18 != 0) goto LAB_003e271a;
        if (*pcVar8 != '\0') goto LAB_003e261d;
        builtin_strncpy(p->ErrorStr + 10,"d .short input.",0x10);
        uVar24._0_1_ = 'C';
        uVar24._1_1_ = 'a';
        uVar24._2_1_ = 'n';
        uVar24._3_1_ = 'n';
        uVar25._0_1_ = 'o';
        uVar25._1_1_ = 't';
        uVar25._2_1_ = ' ';
        uVar25._3_1_ = 'r';
        uVar26._0_1_ = 'e';
        uVar26._1_1_ = 'a';
        uVar26._2_1_ = 'd';
        uVar26._3_1_ = ' ';
        uVar27._0_1_ = '.';
        uVar27._1_1_ = 's';
        uVar27._2_1_ = 'h';
        uVar27._3_1_ = 'o';
        goto LAB_003e1bc8;
      case 10:
        if (p->pNtk == (Prs_Ntk_t *)0x0) {
          if (*pcVar8 != '\0') goto LAB_003e261d;
          builtin_strncpy(p->ErrorStr + 0xf,"without .model.",0x10);
          uVar24._0_1_ = 'D';
          uVar24._1_1_ = 'i';
          uVar24._2_1_ = 'r';
          uVar24._3_1_ = 'e';
          uVar25._0_1_ = 'c';
          uVar25._1_1_ = 't';
          uVar25._2_1_ = 'i';
          uVar25._3_1_ = 'v';
          uVar26._0_1_ = 'e';
          uVar26._1_1_ = ' ';
          uVar26._2_1_ = '.';
          uVar26._3_1_ = 'e';
          uVar27._0_1_ = 'n';
          uVar27._1_1_ = 'd';
          uVar27._2_1_ = ' ';
          uVar27._3_1_ = 'w';
        }
        else {
          p->pNtk = (Prs_Ntk_t *)0x0;
          pbVar15 = (byte *)p->pCur;
LAB_003e1e21:
          bVar4 = *pbVar15;
          if (bVar4 < 0x20) {
            if ((bVar4 != 9) && (bVar4 != 0xd)) goto LAB_003e20f0;
LAB_003e1e5d:
            pbVar15 = pbVar15 + 1;
LAB_003e1e60:
            p->pCur = (char *)pbVar15;
            goto LAB_003e1e21;
          }
          if (bVar4 == 0x20) goto LAB_003e1e5d;
          if (bVar4 == 0x5c) {
            pbVar19 = pbVar15 + 1;
            do {
              p->pCur = (char *)pbVar19;
              pbVar15 = pbVar19 + 1;
              bVar4 = *pbVar19;
              pbVar19 = pbVar15;
            } while (bVar4 != 10);
            goto LAB_003e1e60;
          }
          if (bVar4 == 0x23) {
            do {
              pbVar15 = pbVar15 + 1;
              p->pCur = (char *)pbVar15;
            } while (*pbVar15 != 10);
          }
LAB_003e20f0:
          bVar4 = *p->pCur;
          if (bVar4 < 0xd) {
            if (bVar4 == 10) {
LAB_003e220d:
              iVar18 = 0;
              goto LAB_003e220f;
            }
            if (bVar4 == 9) goto LAB_003e2641;
          }
          else if ((bVar4 == 0x20) || (bVar4 == 0xd)) goto LAB_003e2641;
          if (*pcVar8 != '\0') goto LAB_003e261d;
          builtin_strncpy(p->ErrorStr + 0xf,"s on .end line.",0x10);
          uVar24._0_1_ = 'T';
          uVar24._1_1_ = 'r';
          uVar24._2_1_ = 'a';
          uVar24._3_1_ = 'i';
          uVar25._0_1_ = 'l';
          uVar25._1_1_ = 'i';
          uVar25._2_1_ = 'n';
          uVar25._3_1_ = 'g';
          uVar26._0_1_ = ' ';
          uVar26._1_1_ = 's';
          uVar26._2_1_ = 'y';
          uVar26._3_1_ = 'm';
          uVar27._0_1_ = 'b';
          uVar27._1_1_ = 'o';
          uVar27._2_1_ = 'l';
          uVar27._3_1_ = 's';
        }
LAB_003e1bc8:
        *(undefined4 *)pcVar8 = uVar24;
        *(undefined4 *)(p->ErrorStr + 4) = uVar25;
        *(undefined4 *)(p->ErrorStr + 8) = uVar26;
        *(undefined4 *)(p->ErrorStr + 0xc) = uVar27;
        break;
      default:
        Abc_NamStr(p->pStrs,iVar18);
        printf("Cannot read directive \"%s\".\n");
      }
LAB_003e1bcd:
      iVar18 = 1;
LAB_003e220f:
      if (iVar18 != 0) break;
LAB_003e23b2:
      pcVar7 = p->pCur;
    } while (pcVar7[1] != '\0');
  }
  cVar2 = p->ErrorStr[0];
  if (cVar2 != '\0') {
    pcVar7 = p->pBuffer;
    uVar16 = 0;
    if (pcVar7 < p->pCur) {
      uVar16 = 0;
      do {
        uVar16 = (ulong)((int)uVar16 + (uint)(*pcVar7 == '\n'));
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != p->pCur);
    }
    pVVar13 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar16,p->ErrorStr);
    if (cVar2 != '\0') goto LAB_003e241d;
  }
  pVVar13 = p->vNtks;
  p->vNtks = (Vec_Ptr_t *)0x0;
LAB_003e241d:
  if (p->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pStrs);
  }
  if (p->pFuns != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p->pFuns);
  }
  pHVar10 = p->vHash;
  if (pHVar10 != (Hash_IntMan_t *)0x0) {
    piVar12 = &pHVar10->nRefs;
    *piVar12 = *piVar12 + -1;
    if (*piVar12 == 0) {
      pVVar11 = pHVar10->vObjs;
      if (pVVar11->pArray != (int *)0x0) {
        free(pVVar11->pArray);
        pVVar11->pArray = (int *)0x0;
      }
      if (pVVar11 != (Vec_Int_t *)0x0) {
        free(pVVar11);
      }
      pVVar11 = pHVar10->vTable;
      if (pVVar11->pArray != (int *)0x0) {
        free(pVVar11->pArray);
        pVVar11->pArray = (int *)0x0;
      }
      if (pVVar11 != (Vec_Int_t *)0x0) {
        free(pVVar11);
      }
      free(pHVar10);
    }
  }
  if (p->vNtks != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p->vNtks);
  }
  pcVar7 = (p->vCover).pArray;
  if (pcVar7 != (char *)0x0) {
    free(pcVar7);
    (p->vCover).pArray = (char *)0x0;
  }
  (p->vCover).nCap = 0;
  (p->vCover).nSize = 0;
  piVar12 = (p->vTemp).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vTemp).pArray = (int *)0x0;
  }
  (p->vTemp).nCap = 0;
  (p->vTemp).nSize = 0;
  piVar12 = (p->vTemp2).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vTemp2).pArray = (int *)0x0;
  }
  (p->vTemp2).nCap = 0;
  (p->vTemp2).nSize = 0;
  piVar12 = (p->vTemp3).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vTemp3).pArray = (int *)0x0;
  }
  (p->vTemp3).nCap = 0;
  (p->vTemp3).nSize = 0;
  piVar12 = (p->vTemp4).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vTemp4).pArray = (int *)0x0;
  }
  (p->vTemp4).nCap = 0;
  (p->vTemp4).nSize = 0;
  piVar12 = (p->vKnown).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vKnown).pArray = (int *)0x0;
  }
  (p->vKnown).nCap = 0;
  (p->vKnown).nSize = 0;
  piVar12 = (p->vFailed).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vFailed).pArray = (int *)0x0;
  }
  (p->vFailed).nCap = 0;
  (p->vFailed).nSize = 0;
  piVar12 = (p->vSucceeded).pArray;
  if (piVar12 != (int *)0x0) {
    free(piVar12);
    (p->vSucceeded).pArray = (int *)0x0;
  }
  (p->vSucceeded).nCap = 0;
  (p->vSucceeded).nSize = 0;
  if (p->pBuffer != (char *)0x0) {
    free(p->pBuffer);
    p->pBuffer = (char *)0x0;
  }
  free(p);
  return pVVar13;
}

Assistant:

Vec_Ptr_t * Prs_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, " 0\n", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, " 1\n", NULL );
    Prs_NtkAddBlifDirectives( p );
    Prs_ManReadLines( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}